

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# computation.c
# Opt level: O3

apx_rationalScaling_t * apx_rationalScaling_clone(apx_rationalScaling_t *other)

{
  anon_union_4_2_43a9a9ed_for_upper_limit aVar1;
  apx_rationalScaling_t *paVar2;
  
  if (other != (apx_rationalScaling_t *)0x0) {
    paVar2 = apx_rationalScaling_new(other->offset,other->numerator,other->denominator,other->unit);
    if (paVar2 == (apx_rationalScaling_t *)0x0) {
      paVar2 = (apx_rationalScaling_t *)0x0;
    }
    else {
      (paVar2->base).is_signed_range = (other->base).is_signed_range;
      aVar1 = (other->base).upper_limit;
      (paVar2->base).lower_limit = (other->base).lower_limit;
      (paVar2->base).upper_limit = aVar1;
    }
    return paVar2;
  }
  return (apx_rationalScaling_t *)0x0;
}

Assistant:

apx_rationalScaling_t* apx_rationalScaling_clone(apx_rationalScaling_t const* other)
{
   if (other != NULL)
   {
      apx_rationalScaling_t* self = apx_rationalScaling_new(other->offset, other->numerator, other->denominator, other->unit);
      if (self != NULL)
      {
         apx_computation_assign(&self->base, &other->base);
      }
      return self;
   }
   return NULL;
}